

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

int __thiscall ReadData::decode(ReadData *this,FILE *file)

{
  ostream *this_00;
  void *this_01;
  uchar local_48 [8];
  uchar HeadBuff [25];
  int flag;
  FILE *file_local;
  ReadData *this_local;
  
  this_local._4_4_ = ReadHead(this,file,local_48);
  if (this_local._4_4_ == 0) {
    this_local._4_4_ = ReadMessage(this,file,local_48);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"error happened with code ");
    this_01 = (void *)std::ostream::operator<<(this_00,this_local._4_4_);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return this_local._4_4_;
}

Assistant:

int ReadData::decode(FILE* file) {
    int flag;
    unsigned char HeadBuff[25];
    flag = ReadHead(file, HeadBuff);
    if(flag != 0) {
        cout << "error happened with code " << flag << endl;
        return flag;
    }
    flag = ReadMessage(file, HeadBuff);

    // find neither eph nor obs
    return flag;
}